

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base>::
drop_delivery_filter
          (local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base> *this,
          type_index *msg_type,agent_t *subscriber)

{
  agent_t *subscriber_local;
  type_index *msg_type_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base> *this_local;
  
  modify_and_remove_subscriber_if_needed<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base>::drop_delivery_filter(std::type_index_const&,so_5::agent_t&)::_lambda(so_5::impl::local_mbox_details::subscriber_info_t&)_1_>
            (this,msg_type,subscriber);
  return;
}

Assistant:

SO_5_NOEXCEPT override
			{
				modify_and_remove_subscriber_if_needed(
						msg_type,
						&subscriber,
						[]( local_mbox_details::subscriber_info_t & info ) {
							info.drop_filter();
						} );
			}